

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

Status cmsys::SystemTools::CopyFileAlways(string *source,string *destination)

{
  bool bVar1;
  ulong uVar2;
  string local_e8;
  string local_c8;
  undefined1 local_a8 [8];
  string source_name;
  string destination_dir;
  undefined1 local_50 [8];
  string real_destination;
  Status perms;
  mode_t perm;
  string *destination_local;
  string *source_local;
  Status status;
  
  unique0x100003e1 = destination;
  Status::Status((Status *)&source_local);
  perms.Kind_ = Success;
  register0x00000000 = GetPermissions(source,&perms.Kind_);
  std::__cxx11::string::string((string *)local_50,(string *)stack0xffffffffffffffe0);
  bVar1 = FileIsDirectory(source);
  if (bVar1) {
    source_local = (string *)MakeDirectory(stack0xffffffffffffffe0,(mode_t *)0x0);
    bVar1 = Status::IsSuccess((Status *)&source_local);
    if (!bVar1) goto LAB_00152133;
  }
  else {
    std::__cxx11::string::string((string *)(source_name.field_2._M_local_buf + 8));
    bVar1 = FileIsDirectory(stack0xffffffffffffffe0);
    if (bVar1) {
      std::__cxx11::string::operator=
                ((string *)(source_name.field_2._M_local_buf + 8),(string *)local_50);
      ConvertToUnixSlashes((string *)local_50);
      std::__cxx11::string::operator+=((string *)local_50,'/');
      std::__cxx11::string::string((string *)local_a8,(string *)source);
      GetFilenameName(&local_c8,(string *)local_a8);
      std::__cxx11::string::operator+=((string *)local_50,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)local_a8);
    }
    else {
      GetFilenamePath(&local_e8,stack0xffffffffffffffe0);
      std::__cxx11::string::operator=
                ((string *)(source_name.field_2._M_local_buf + 8),(string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
    }
    bVar1 = SameFile(source,(string *)local_50);
    if (bVar1) {
      bVar1 = true;
    }
    else {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        source_local = (string *)
                       MakeDirectory((string *)((long)&source_name.field_2 + 8),(mode_t *)0x0);
        bVar1 = Status::IsSuccess((Status *)&source_local);
        if (!bVar1) {
          bVar1 = true;
          goto LAB_001520c0;
        }
      }
      source_local = (string *)CloneFileContent(source,(string *)local_50);
      bVar1 = Status::IsSuccess((Status *)&source_local);
      if (!bVar1) {
        source_local = (string *)CopyFileContentBlockwise(source,(string *)local_50);
      }
      bVar1 = Status::IsSuccess((Status *)&source_local);
      if (bVar1) {
        bVar1 = false;
      }
      else {
        bVar1 = true;
      }
    }
LAB_001520c0:
    std::__cxx11::string::~string((string *)(source_name.field_2._M_local_buf + 8));
    if (bVar1) goto LAB_00152133;
  }
  bVar1 = Status::operator_cast_to_bool((Status *)((long)&real_destination.field_2 + 0xc));
  if (bVar1) {
    source_local = (string *)SetPermissions((string *)local_50,perms.Kind_,false);
  }
LAB_00152133:
  std::__cxx11::string::~string((string *)local_50);
  return (Status)source_local;
}

Assistant:

Status SystemTools::CopyFileAlways(std::string const& source,
                                   std::string const& destination)
{
  Status status;
  mode_t perm = 0;
  Status perms = SystemTools::GetPermissions(source, perm);
  std::string real_destination = destination;

  if (SystemTools::FileIsDirectory(source)) {
    status = SystemTools::MakeDirectory(destination);
    if (!status.IsSuccess()) {
      return status;
    }
  } else {
    // If destination is a directory, try to create a file with the same
    // name as the source in that directory.

    std::string destination_dir;
    if (SystemTools::FileIsDirectory(destination)) {
      destination_dir = real_destination;
      SystemTools::ConvertToUnixSlashes(real_destination);
      real_destination += '/';
      std::string source_name = source;
      real_destination += SystemTools::GetFilenameName(source_name);
    } else {
      destination_dir = SystemTools::GetFilenamePath(destination);
    }
    // If files are the same do not copy
    if (SystemTools::SameFile(source, real_destination)) {
      return status;
    }

    // Create destination directory
    if (!destination_dir.empty()) {
      status = SystemTools::MakeDirectory(destination_dir);
      if (!status.IsSuccess()) {
        return status;
      }
    }

    status = SystemTools::CloneFileContent(source, real_destination);
    // if cloning did not succeed, fall back to blockwise copy
    if (!status.IsSuccess()) {
      status = SystemTools::CopyFileContentBlockwise(source, real_destination);
    }
    if (!status.IsSuccess()) {
      return status;
    }
  }
  if (perms) {
    status = SystemTools::SetPermissions(real_destination, perm);
  }
  return status;
}